

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteSpherical::Initialize
          (ChLinkRevoluteSpherical *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,ChCoordsys<double> *csys,double distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  element_type *peVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ChBodyFrame *pCVar21;
  ChBodyFrame *pCVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double local_38;
  double local_30;
  double local_28;
  
  peVar12 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar22 = &peVar12->super_ChBodyFrame;
  if (peVar12 == (element_type *)0x0) {
    pCVar22 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar22;
  peVar12 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar21 = &peVar12->super_ChBodyFrame;
  if (peVar12 == (element_type *)0x0) {
    pCVar21 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar21;
  iVar19 = (*(pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar20 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var,iVar19),
             (ChVariables *)CONCAT44(extraout_var_00,iVar20));
  iVar19 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar20 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_01,iVar19),
             (ChVariables *)CONCAT44(extraout_var_02,iVar20));
  dVar1 = (csys->rot).m_data[0];
  dVar2 = (csys->rot).m_data[1];
  dVar3 = (csys->rot).m_data[2];
  dVar4 = (csys->rot).m_data[3];
  pCVar22 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformParentToLocal
            (&csys->pos,&(pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  if ((ChVector<double> *)&local_38 != &this->m_pos1) {
    (this->m_pos1).m_data[0] = local_38;
    (this->m_pos1).m_data[1] = local_30;
    (this->m_pos1).m_data[2] = local_28;
  }
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar4;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar4 * dVar4;
  auVar16 = vfmadd231sd_fma(auVar23,auVar42,auVar42);
  auVar14 = vfmadd213sd_fma(auVar16,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar2;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar3;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 * dVar2;
  auVar16 = vfmsub231sd_fma(auVar31,auVar43,auVar38);
  dVar13 = auVar16._0_8_ + auVar16._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 * dVar3;
  auVar16 = vfmadd213sd_fma(auVar38,auVar40,auVar34);
  dVar3 = auVar16._0_8_ + auVar16._0_8_;
  auVar18 = vfmsub231sd_fma(auVar34,auVar40,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1 * dVar4;
  auVar17 = vfmadd231sd_fma(auVar39,auVar40,auVar43);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar2 * dVar2;
  auVar16 = vfmadd231sd_fma(auVar41,auVar42,auVar42);
  auVar15 = vfmadd213sd_fma(auVar16,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  pCVar22 = (this->super_ChLink).Body1;
  pCVar21 = (this->super_ChLink).Body2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       dVar13 * (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar3;
  auVar16 = vfmadd231sd_fma(auVar26,auVar36,auVar16);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar16 = vfmadd231sd_fma(auVar16,auVar14,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       dVar13 * (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar5 = vfmadd231sd_fma(auVar29,auVar36,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar5 = vfmadd231sd_fma(auVar5,auVar14,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       dVar13 * (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar3;
  auVar6 = vfmadd231sd_fma(auVar32,auVar37,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar22->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar6 = vfmadd231sd_fma(auVar6,auVar14,auVar9);
  (this->m_dir1).m_data[0] = auVar6._0_8_;
  (this->m_dir1).m_data[1] = auVar5._0_8_;
  (this->m_dir1).m_data[2] = auVar16._0_8_;
  dVar1 = ((auVar18._0_8_ + auVar18._0_8_) * distance + (csys->pos).m_data[2]) -
          (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  dVar2 = (auVar15._0_8_ * distance + (csys->pos).m_data[0]) -
          (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar3 = ((auVar17._0_8_ + auVar17._0_8_) * distance + (csys->pos).m_data[1]) -
          (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       dVar3 * (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar16 = vfmadd231sd_fma(auVar33,auVar27,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1;
  auVar16 = vfmadd231sd_fma(auVar16,auVar24,auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       dVar3 * (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar5 = vfmadd231sd_fma(auVar35,auVar27,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar5 = vfmadd231sd_fma(auVar5,auVar24,auVar18);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       dVar3 * (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar6 = vfmadd231sd_fma(auVar30,auVar28,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar21->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar6 = vfmadd231sd_fma(auVar6,auVar25,auVar11);
  (this->m_pos2).m_data[0] = auVar6._0_8_;
  (this->m_pos2).m_data[1] = auVar5._0_8_;
  (this->m_pos2).m_data[2] = auVar16._0_8_;
  this->m_dist = distance;
  this->m_cur_dist = distance;
  this->m_cur_dot = 0.0;
  return;
}

Assistant:

void ChLinkRevoluteSpherical::Initialize(std::shared_ptr<ChBody> body1,
                                         std::shared_ptr<ChBody> body2,
                                         const ChCoordsys<>& csys,
                                         double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> x_Axis = csys.rot.GetXaxis();
    ChVector<> z_axis = csys.rot.GetZaxis();

    m_pos1 = Body1->TransformPointParentToLocal(csys.pos);
    m_dir1 = Body1->TransformDirectionParentToLocal(z_axis);
    m_pos2 = Body2->TransformPointParentToLocal(csys.pos + distance * x_Axis);

    m_dist = distance;
    m_cur_dist = distance;
    m_cur_dot = 0;
}